

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_file.c
# Opt level: O1

t_file_handle * file_splitext_new(t_symbol *s,int argc,t_atom *argv)

{
  t_file_handle *ptVar1;
  undefined4 in_register_00000034;
  mode_t in_R9D;
  
  ptVar1 = do_file_handle_new(file_splitext_class,(t_symbol *)CONCAT44(in_register_00000034,argc),
                              (int)argv,(t_atom *)0x0,0,in_R9D);
  return ptVar1;
}

Assistant:

static t_pd *fileobj_new(t_symbol *s, int argc, t_atom*argv)
{
    t_file_handle*x = 0;
    const char*verb=0;
    if(gensym("file") == s) {
        if (argc && A_SYMBOL == argv->a_type) {
            verb = atom_getsymbol(argv)->s_name;
            argc--;
            argv++;
        } else {
            verb = "handle";
        }
    } else if (strlen(s->s_name)>5) {
        verb = s->s_name + 5;
    }
    if (!verb || !*verb)
        x = do_file_handle_new(file_handle_class, gensym("file handle"), argc, argv, 1, 0666);
    else {
#define ELIF_FILE_PD_NEW(name, verbose, creationmode) else              \
            if (!strcmp(verb, #name))                                   \
                x = do_file_handle_new(file_##name##_class, gensym("file "#name), argc, argv, verbose, creationmode)

        if (!strcmp(verb, "define"))
            x = file_define_new(gensym("file define"), argc, argv);
        else if (!strcmp(verb, "handle"))
            x = file_handle_new(gensym("file handle"), argc, argv);
        ELIF_FILE_PD_NEW(handle, 1, 0666);
        ELIF_FILE_PD_NEW(which, 0, 0);
        ELIF_FILE_PD_NEW(glob, 0, 0);
        ELIF_FILE_PD_NEW(stat, 0, 0);
        ELIF_FILE_PD_NEW(size, 0, 0);
        ELIF_FILE_PD_NEW(isfile, 0, 0);
        ELIF_FILE_PD_NEW(isdirectory, 0, 0);
        ELIF_FILE_PD_NEW(mkdir, 0, 0777);
        ELIF_FILE_PD_NEW(delete, 0, 0);
        ELIF_FILE_PD_NEW(copy, 0, 0);
        ELIF_FILE_PD_NEW(move, 0, 0);
        ELIF_FILE_PD_NEW(split, 0, 0);
        ELIF_FILE_PD_NEW(join, 0, 0);
        ELIF_FILE_PD_NEW(splitext, 0, 0);
        ELIF_FILE_PD_NEW(splitname, 0, 0);
        else {
            pd_error(0, "file %s: unknown function", verb);
        }
    }
    return (t_pd*)x;
}